

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int rmw_mip(CPURISCVState_conflict2 *env,int csrno,target_ulong *ret_value,target_ulong new_value,
           target_ulong write_mask)

{
  uint mask_00;
  RISCVCPU_conflict *cpu_00;
  ulong uVar1;
  uint local_44;
  uint32_t old_mip;
  target_ulong mask;
  RISCVCPU_conflict1 *cpu;
  target_ulong write_mask_local;
  target_ulong new_value_local;
  target_ulong *ret_value_local;
  int csrno_local;
  CPURISCVState_conflict2 *env_local;
  
  cpu_00 = (RISCVCPU_conflict *)env_archcpu(env);
  uVar1 = write_mask & 0x666 & (ulong)(env->miclaim ^ 0xffffffff);
  if (uVar1 == 0) {
    local_44 = (uint)env->mip;
  }
  else {
    mask_00 = (uint)uVar1;
    local_44 = riscv_cpu_update_mip_riscv64(cpu_00,mask_00,(uint)new_value & mask_00);
  }
  if (ret_value != (target_ulong *)0x0) {
    *ret_value = (ulong)local_44;
  }
  return 0;
}

Assistant:

static int rmw_mip(CPURISCVState *env, int csrno, target_ulong *ret_value,
                   target_ulong new_value, target_ulong write_mask)
{
    RISCVCPU *cpu = env_archcpu(env);
    /* Allow software control of delegable interrupts not claimed by hardware */
    target_ulong mask = write_mask & delegable_ints & ~env->miclaim;
    uint32_t old_mip;

    if (mask) {
        old_mip = riscv_cpu_update_mip(cpu, mask, (new_value & mask));
    } else {
        old_mip = env->mip;
    }

    if (ret_value) {
        *ret_value = old_mip;
    }

    return 0;
}